

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  Type *pTVar1;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  Boxed local_19;
  void *pvStack_18;
  Type value;
  Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_> *field_local;
  ostream *os_local;
  
  pvStack_18 = __buf;
  pTVar1 = Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>::get
                     ((Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_> *)__buf);
  local_19.m_value = pTVar1->m_value;
  poVar2 = (ostream *)std::ostream::operator<<((void *)CONCAT44(in_register_0000003c,__fd),0x61);
  poVar2 = std::operator<<(poVar2,"=");
  poVar2 = Type::operator<<(poVar2,&local_19);
  std::operator<<(poVar2,'|');
  return (ssize_t)(void *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }